

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall CommandDrawInventoryBar::~CommandDrawInventoryBar(CommandDrawInventoryBar *this)

{
  uint uVar1;
  CommandDrawNumber **ppCVar2;
  ulong uVar3;
  
  (this->super_SBarInfoCommand)._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawInventoryBar_0088af90;
  ppCVar2 = this->counters;
  if (ppCVar2 == (CommandDrawNumber **)0x0) {
    return;
  }
  uVar1 = this->size;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if (this->counters[uVar3] != (CommandDrawNumber *)0x0) {
        (*(this->counters[uVar3]->super_CommandDrawString).super_SBarInfoCommand.
          _vptr_SBarInfoCommand[1])();
        uVar1 = this->size;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
    ppCVar2 = this->counters;
    if (ppCVar2 == (CommandDrawNumber **)0x0) {
      return;
    }
  }
  operator_delete__(ppCVar2);
  return;
}

Assistant:

~CommandDrawInventoryBar()
		{
			if(counters != NULL)
			{
				for(unsigned int i = 0;i < size;i++)
					delete counters[i];
				delete[] counters;
			}
		}